

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

void __thiscall icu_63::RuleBasedBreakIterator::DictionaryCache::reset(DictionaryCache *this)

{
  this->fPositionInCache = -1;
  this->fStart = 0;
  this->fLimit = 0;
  this->fFirstRuleStatusIndex = 0;
  this->fOtherRuleStatusIndex = 0;
  UVector32::removeAllElements(&this->fBreaks);
  return;
}

Assistant:

void RuleBasedBreakIterator::DictionaryCache::reset() {
    fPositionInCache = -1;
    fStart = 0;
    fLimit = 0;
    fFirstRuleStatusIndex = 0;
    fOtherRuleStatusIndex = 0;
    fBreaks.removeAllElements();
}